

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

char * GetExpressionTreeNodeName(ExprBase *expression)

{
  ExprBase *expression_local;
  
  switch(expression->typeID) {
  case 0:
    expression_local = (ExprBase *)anon_var_dwarf_619ad;
    break;
  case 1:
    expression_local = (ExprBase *)anon_var_dwarf_619b9;
    break;
  case 2:
    expression_local = (ExprBase *)anon_var_dwarf_619c5;
    break;
  case 3:
    expression_local = (ExprBase *)anon_var_dwarf_619d1;
    break;
  case 4:
    expression_local = (ExprBase *)anon_var_dwarf_619e9;
    break;
  case 5:
    expression_local = (ExprBase *)anon_var_dwarf_619f5;
    break;
  case 6:
    expression_local = (ExprBase *)anon_var_dwarf_61a01;
    break;
  case 7:
    expression_local = (ExprBase *)anon_var_dwarf_61a0d;
    break;
  case 8:
    expression_local = (ExprBase *)anon_var_dwarf_61a19;
    break;
  case 9:
    expression_local = (ExprBase *)anon_var_dwarf_61a25;
    break;
  case 10:
    expression_local = (ExprBase *)anon_var_dwarf_61a31;
    break;
  default:
    __assert_fail("!\"unknown type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x3707,"const char *GetExpressionTreeNodeName(ExprBase *)");
  case 0xe:
    expression_local = (ExprBase *)anon_var_dwarf_61a3d;
    break;
  case 0xf:
    expression_local = (ExprBase *)anon_var_dwarf_61a49;
    break;
  case 0x10:
    expression_local = (ExprBase *)anon_var_dwarf_61a55;
    break;
  case 0x11:
    expression_local = (ExprBase *)anon_var_dwarf_61a61;
    break;
  case 0x12:
    expression_local = (ExprBase *)anon_var_dwarf_61a6d;
    break;
  case 0x13:
    expression_local = (ExprBase *)anon_var_dwarf_61a79;
    break;
  case 0x14:
    expression_local = (ExprBase *)anon_var_dwarf_61a85;
    break;
  case 0x15:
    expression_local = (ExprBase *)anon_var_dwarf_61a91;
    break;
  case 0x16:
    expression_local = (ExprBase *)anon_var_dwarf_61a9d;
    break;
  case 0x17:
    expression_local = (ExprBase *)anon_var_dwarf_61aa9;
    break;
  case 0x18:
    expression_local = (ExprBase *)anon_var_dwarf_61ab5;
    break;
  case 0x19:
    expression_local = (ExprBase *)anon_var_dwarf_61ac1;
    break;
  case 0x1a:
    expression_local = (ExprBase *)anon_var_dwarf_61acd;
    break;
  case 0x1b:
    expression_local = (ExprBase *)anon_var_dwarf_61ad9;
    break;
  case 0x1c:
    expression_local = (ExprBase *)anon_var_dwarf_61ae5;
    break;
  case 0x1d:
    expression_local = (ExprBase *)anon_var_dwarf_61af1;
    break;
  case 0x1e:
    expression_local = (ExprBase *)anon_var_dwarf_61afd;
    break;
  case 0x1f:
    expression_local = (ExprBase *)anon_var_dwarf_61b09;
    break;
  case 0x20:
    expression_local = (ExprBase *)anon_var_dwarf_61b15;
    break;
  case 0x21:
    expression_local = (ExprBase *)anon_var_dwarf_61b21;
    break;
  case 0x22:
    expression_local = (ExprBase *)anon_var_dwarf_61b39;
    break;
  case 0x23:
    expression_local = (ExprBase *)anon_var_dwarf_61b45;
    break;
  case 0x24:
    expression_local = (ExprBase *)anon_var_dwarf_61b51;
    break;
  case 0x25:
    expression_local = (ExprBase *)anon_var_dwarf_61b5d;
    break;
  case 0x26:
    expression_local = (ExprBase *)anon_var_dwarf_61b69;
    break;
  case 0x27:
    expression_local = (ExprBase *)anon_var_dwarf_61b75;
    break;
  case 0x28:
    expression_local = (ExprBase *)anon_var_dwarf_61b81;
    break;
  case 0x29:
    expression_local = (ExprBase *)anon_var_dwarf_61b8d;
    break;
  case 0x2a:
    expression_local = (ExprBase *)anon_var_dwarf_61b99;
    break;
  case 0x2b:
    expression_local = (ExprBase *)anon_var_dwarf_61ba5;
    break;
  case 0x2c:
    expression_local = (ExprBase *)anon_var_dwarf_61bb1;
    break;
  case 0x2d:
    expression_local = (ExprBase *)anon_var_dwarf_61bbd;
    break;
  case 0x2e:
    expression_local = (ExprBase *)anon_var_dwarf_61bc9;
    break;
  case 0x2f:
    expression_local = (ExprBase *)anon_var_dwarf_61bd5;
    break;
  case 0x30:
    expression_local = (ExprBase *)anon_var_dwarf_61be1;
    break;
  case 0x31:
    expression_local = (ExprBase *)anon_var_dwarf_61bed;
    break;
  case 0x32:
    expression_local = (ExprBase *)anon_var_dwarf_61bf9;
    break;
  case 0x33:
    expression_local = (ExprBase *)anon_var_dwarf_61c05;
    break;
  case 0x34:
    expression_local = (ExprBase *)anon_var_dwarf_61c11;
    break;
  case 0x35:
    expression_local = (ExprBase *)anon_var_dwarf_61c1d;
    break;
  case 0x36:
    expression_local = (ExprBase *)anon_var_dwarf_61c29;
    break;
  case 0x37:
    expression_local = (ExprBase *)anon_var_dwarf_61c35;
    break;
  case 0x38:
    expression_local = (ExprBase *)anon_var_dwarf_61c41;
  }
  return (char *)expression_local;
}

Assistant:

const char* GetExpressionTreeNodeName(ExprBase *expression)
{
	switch(expression->typeID)
	{
	case ExprError::myTypeID:
		return "ExprError";
	case ExprErrorTypeMemberAccess::myTypeID:
		return "ExprErrorTypeMemberAccess";
	case ExprVoid::myTypeID:
		return "ExprVoid";
	case ExprBoolLiteral::myTypeID:
		return "ExprBoolLiteral";
	case ExprCharacterLiteral::myTypeID:
		return "ExprCharacterLiteral";
	case ExprStringLiteral::myTypeID:
		return "ExprStringLiteral";
	case ExprIntegerLiteral::myTypeID:
		return "ExprIntegerLiteral";
	case ExprRationalLiteral::myTypeID:
		return "ExprRationalLiteral";
	case ExprTypeLiteral::myTypeID:
		return "ExprTypeLiteral";
	case ExprNullptrLiteral::myTypeID:
		return "ExprNullptrLiteral";
	case ExprFunctionIndexLiteral::myTypeID:
		return "ExprFunctionIndexLiteral";
	case ExprPassthrough::myTypeID:
		return "ExprPassthrough";
	case ExprArray::myTypeID:
		return "ExprArray";
	case ExprPreModify::myTypeID:
		return "ExprPreModify";
	case ExprPostModify::myTypeID:
		return "ExprPostModify";
	case ExprTypeCast::myTypeID:
		return "ExprTypeCast";
	case ExprUnaryOp::myTypeID:
		return "ExprUnaryOp";
	case ExprBinaryOp::myTypeID:
		return "ExprBinaryOp";
	case ExprGetAddress::myTypeID:
		return "ExprGetAddress";
	case ExprDereference::myTypeID:
		return "ExprDereference";
	case ExprUnboxing::myTypeID:
		return "ExprUnboxing";
	case ExprConditional::myTypeID:
		return "ExprConditional";
	case ExprAssignment::myTypeID:
		return "ExprAssignment";
	case ExprMemberAccess::myTypeID:
		return "ExprMemberAccess";
	case ExprArrayIndex::myTypeID:
		return "ExprArrayIndex";
	case ExprReturn::myTypeID:
		return "ExprReturn";
	case ExprYield::myTypeID:
		return "ExprYield";
	case ExprVariableDefinition::myTypeID:
		return "ExprVariableDefinition";
	case ExprZeroInitialize::myTypeID:
		return "ExprZeroInitialize";
	case ExprArraySetup::myTypeID:
		return "ExprArraySetup";
	case ExprVariableDefinitions::myTypeID:
		return "ExprVariableDefinitions";
	case ExprVariableAccess::myTypeID:
		return "ExprVariableAccess";
	case ExprFunctionContextAccess::myTypeID:
		return "ExprFunctionContextAccess";
	case ExprFunctionDefinition::myTypeID:
		return "ExprFunctionDefinition";
	case ExprGenericFunctionPrototype::myTypeID:
		return "ExprGenericFunctionPrototype";
	case ExprFunctionAccess::myTypeID:
		return "ExprFunctionAccess";
	case ExprFunctionOverloadSet::myTypeID:
		return "ExprFunctionOverloadSet";
	case ExprShortFunctionOverloadSet::myTypeID:
		return "ExprShortFunctionOverloadSet";
	case ExprFunctionCall::myTypeID:
		return "ExprFunctionCall";
	case ExprAliasDefinition::myTypeID:
		return "ExprAliasDefinition";
	case ExprClassPrototype::myTypeID:
		return "ExprClassPrototype";
	case ExprGenericClassPrototype::myTypeID:
		return "ExprGenericClassPrototype";
	case ExprClassDefinition::myTypeID:
		return "ExprClassDefinition";
	case ExprEnumDefinition::myTypeID:
		return "ExprEnumDefinition";
	case ExprIfElse::myTypeID:
		return "ExprIfElse";
	case ExprFor::myTypeID:
		return "ExprFor";
	case ExprWhile::myTypeID:
		return "ExprWhile";
	case ExprDoWhile::myTypeID:
		return "ExprDoWhile";
	case ExprSwitch::myTypeID:
		return "ExprSwitch";
	case ExprBreak::myTypeID:
		return "ExprBreak";
	case ExprContinue::myTypeID:
		return "ExprContinue";
	case ExprBlock::myTypeID:
		return "ExprBlock";
	case ExprSequence::myTypeID:
		return "ExprSequence";
	case ExprModule::myTypeID:
		return "ExprModule";
	default:
		break;
	}
	
	assert(!"unknown type");
	return "unknown";
}